

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_change_threshold(filemgr *file,size_t new_threshold)

{
  avl_node *paVar1;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  avl_cmp_func *in_stack_fffffffffffffaa8;
  avl_node *in_stack_fffffffffffffab0;
  avl_tree *in_stack_fffffffffffffab8;
  
  strcpy(&stack0xfffffffffffffaa8,(char *)*in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8)
  ;
  if (paVar1 != (avl_node *)0x0) {
    *(undefined1 *)((long)&paVar1[-10].right + 7) = in_SIL;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return;
}

Assistant:

void compactor_change_threshold(struct filemgr *file, size_t new_threshold)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        elem->config.compaction_threshold = new_threshold;
    }
    mutex_unlock(&cpt_lock);
}